

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  long lVar1;
  xmlChar *pxVar2;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  int iVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 2) {
    if (1 < ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      iVar5 = ctxt->valueNr;
      lVar1 = (long)iVar5;
      if (lVar1 < 1) {
        pxVar3 = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->valueNr = iVar5 + -1;
        if (iVar5 == 1) {
          pxVar3 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar3 = ctxt->valueTab[lVar1 + -2];
        }
        ctxt->value = pxVar3;
        pxVar3 = ctxt->valueTab[lVar1 + -1];
        ctxt->valueTab[lVar1 + -1] = (xmlXPathObjectPtr)0x0;
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      iVar5 = ctxt->valueNr;
      lVar1 = (long)iVar5;
      if (lVar1 < 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->valueNr = iVar5 + -1;
        if (iVar5 == 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar4 = ctxt->valueTab[lVar1 + -2];
        }
        ctxt->value = pxVar4;
        pxVar4 = ctxt->valueTab[lVar1 + -1];
        ctxt->valueTab[lVar1 + -1] = (xmlXPathObjectPtr)0x0;
      }
      if (ctxt->error == 0) {
        pxVar2 = xmlStrstr(pxVar4->stringval,pxVar3->stringval);
        if (pxVar2 == (xmlChar *)0x0) {
          pxVar2 = xmlStrdup("");
        }
        else {
          pxVar2 = xmlStrndup(pxVar4->stringval,(int)pxVar2 - (int)pxVar4->stringval);
        }
        if (pxVar2 == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        else {
          value = xmlXPathCacheWrapString(ctxt,pxVar2);
          xmlXPathValuePush(ctxt,value);
        }
      }
      xmlXPathReleaseObject(ctxt->context,pxVar4);
      xmlXPathReleaseObject(ctxt->context,pxVar3);
      return;
    }
    iVar5 = 0x17;
  }
  else {
    iVar5 = 0xc;
  }
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr find = NULL;
    const xmlChar *point;
    xmlChar *result;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    find = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    point = xmlStrstr(str->stringval, find->stringval);
    if (point == NULL) {
        result = xmlStrdup(BAD_CAST "");
    } else {
        result = xmlStrndup(str->stringval, point - str->stringval);
    }
    if (result == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, result));

error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, find);
}